

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O2

void __thiscall
GdlSetAttrItem::MergeColRangeAndPriority
          (GdlSetAttrItem *this,GrcManager *pcman,GrcFont *pfont,int ipavsFlags,int ipavsRange,
          int ipavsPriority)

{
  GrcSymbolTable *pGVar1;
  int iVar2;
  Symbol pGVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GdlBinaryExpression *this_00;
  GdlBinaryExpression *this_01;
  GdlBinaryExpression *pGVar4;
  undefined4 extraout_var_02;
  GdlAttrValueSpec *this_02;
  bool fCanSub;
  uint local_114;
  GdlSetAttrItem *local_110;
  GdlExpression *local_108;
  allocator local_fd;
  uint local_fc;
  Symbol local_f8;
  Symbol local_f0;
  GrcFont *local_e8;
  SymbolSet setpsymBogus;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((ipavsPriority & ipavsRange) == 0xffffffff) {
    return;
  }
  pGVar1 = pcman->m_psymtbl;
  local_114 = ipavsPriority;
  local_110 = this;
  local_fc = ipavsFlags;
  local_e8 = pfont;
  std::__cxx11::string::string((string *)&local_50,"collision",(allocator *)&fCanSub);
  std::__cxx11::string::string((string *)&local_70,"flags",&local_fd);
  GrcStructName::GrcStructName((GrcStructName *)&setpsymBogus,&local_50,&local_70);
  local_f0 = GrcSymbolTable::FindSymbol(pGVar1,(GrcStructName *)&setpsymBogus);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&setpsymBogus);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  pGVar1 = pcman->m_psymtbl;
  std::__cxx11::string::string((string *)&local_90,"=",(allocator *)&setpsymBogus);
  pGVar3 = GrcSymbolTable::FindSymbol(pGVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if ((int)local_fc < 0) {
    local_108 = (GdlExpression *)0x0;
  }
  else {
    iVar2 = (**(local_110->m_vpavs).
               super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_fc]->m_pexpValue->_vptr_GdlExpression)();
    local_108 = (GdlExpression *)CONCAT44(extraout_var,iVar2);
  }
  if (ipavsRange < 0) {
    pGVar4 = (GdlBinaryExpression *)0x0;
  }
  else {
    iVar2 = (**(local_110->m_vpavs).
               super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
               super__Vector_impl_data._M_start[(uint)ipavsRange]->m_pexpValue->_vptr_GdlExpression)
                      ();
    pGVar4 = (GdlBinaryExpression *)CONCAT44(extraout_var_00,iVar2);
  }
  local_f8 = pGVar3;
  if ((int)local_114 < 0) {
    this_01 = (GdlBinaryExpression *)0x0;
  }
  else {
    iVar2 = (**(local_110->m_vpavs).
               super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_114]->m_pexpValue->_vptr_GdlExpression)();
    this_01 = (GdlBinaryExpression *)CONCAT44(extraout_var_01,iVar2);
  }
  pGVar1 = pcman->m_psymtbl;
  std::__cxx11::string::string((string *)&local_b0,"+",(allocator *)&setpsymBogus);
  pGVar3 = GrcSymbolTable::FindSymbol(pGVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  setpsymBogus._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setpsymBogus._M_t._M_impl.super__Rb_tree_header._M_header;
  setpsymBogus._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setpsymBogus._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setpsymBogus._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  setpsymBogus._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setpsymBogus._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((pGVar4 == (GdlBinaryExpression *)0x0) || (this_01 == (GdlBinaryExpression *)0x0)) {
    if ((local_108 == (GdlExpression *)0x0) || (pGVar4 == (GdlBinaryExpression *)0x0)) {
      if ((local_108 == (GdlExpression *)0x0) || (this_01 == (GdlBinaryExpression *)0x0)) {
        if (pGVar4 != (GdlBinaryExpression *)0x0) {
          this_01 = pGVar4;
        }
      }
      else {
        pGVar4 = (GdlBinaryExpression *)operator_new(0x50);
        GdlBinaryExpression::GdlBinaryExpression
                  (pGVar4,pGVar3,&this_01->super_GdlExpression,local_108);
        this_01 = pGVar4;
      }
    }
    else {
      this_01 = (GdlBinaryExpression *)operator_new(0x50);
      GdlBinaryExpression::GdlBinaryExpression
                (this_01,pGVar3,&pGVar4->super_GdlExpression,local_108);
    }
  }
  else {
    this_00 = (GdlBinaryExpression *)operator_new(0x50);
    GdlBinaryExpression::GdlBinaryExpression
              (this_00,pGVar3,&pGVar4->super_GdlExpression,&this_01->super_GdlExpression);
    this_01 = this_00;
    if (local_108 != (GdlExpression *)0x0) {
      this_01 = (GdlBinaryExpression *)operator_new(0x50);
      GdlBinaryExpression::GdlBinaryExpression(this_01,pGVar3,local_108,(GdlExpression *)this_00);
    }
  }
  iVar2 = (*(this_01->super_GdlExpression)._vptr_GdlExpression[0xf])
                    (this_01,pcman->m_pgax,0xffff,&setpsymBogus,local_e8,0,&fCanSub);
  if (this_01 != (GdlBinaryExpression *)CONCAT44(extraout_var_02,iVar2)) {
    (*(this_01->super_GdlExpression)._vptr_GdlExpression[2])(this_01);
  }
  this_02 = (GdlAttrValueSpec *)operator_new(0x48);
  GdlAttrValueSpec::GdlAttrValueSpec
            (this_02,local_f0,local_f8,(GdlExpression *)CONCAT44(extraout_var_02,iVar2));
  if ((int)local_fc < 0) {
    if (ipavsRange < 0) {
      ReplaceAttrSetting(local_110,local_114,this_02);
      goto LAB_001302ca;
    }
    ReplaceAttrSetting(local_110,ipavsRange,this_02);
  }
  else {
    ReplaceAttrSetting(local_110,local_fc,this_02);
    if (-1 < ipavsRange) {
      EraseAttrSetting(local_110,ipavsRange);
    }
  }
  if (-1 < (int)local_114) {
    EraseAttrSetting(local_110,local_114);
  }
LAB_001302ca:
  std::
  _Rb_tree<GrcSymbolTableEntry_*,_GrcSymbolTableEntry_*,_std::_Identity<GrcSymbolTableEntry_*>,_SymbolLess,_std::allocator<GrcSymbolTableEntry_*>_>
  ::~_Rb_tree(&setpsymBogus._M_t);
  return;
}

Assistant:

void GdlSetAttrItem::MergeColRangeAndPriority(GrcManager * pcman, GrcFont * pfont,
	int ipavsFlags, int ipavsRange, int ipavsPriority)
{
	if (ipavsRange == -1 && ipavsPriority == -1)
		return;

	Symbol psymCollisionFlags = pcman->SymbolTable()->FindSymbol(GrcStructName("collision", "flags"));
	Symbol psymEquals = pcman->SymbolTable()->FindSymbol("=");

	GdlExpression * pexpFlagsOld = nullptr;
	GdlExpression * pexpRange = nullptr;
	GdlExpression * pexpPriority = nullptr;
	if (ipavsFlags >= 0)
		pexpFlagsOld = m_vpavs[ipavsFlags]->m_pexpValue->Clone();
	if (ipavsRange >= 0)
		pexpRange = m_vpavs[ipavsRange]->m_pexpValue->Clone();
	if (ipavsPriority >= 0)
		pexpPriority = m_vpavs[ipavsPriority]->m_pexpValue->Clone();

	Symbol psymPlus = pcman->SymbolTable()->FindSymbol("+");
	GdlExpression * pexpFlagsTemp = nullptr;
	GdlExpression * pexpFlags;
	SymbolSet setpsymBogus;
	bool fCanSub;
	if (pexpRange && pexpPriority)
	{
		pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpRange, pexpPriority);
		if (pexpFlagsOld)
			pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpFlagsOld, pexpFlagsTemp);
	}
	else if (pexpRange && pexpFlagsOld)
		pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpRange, pexpFlagsOld);
	else if (pexpPriority && pexpFlagsOld)
		pexpFlagsTemp = new GdlBinaryExpression(psymPlus, pexpPriority, pexpFlagsOld);
	else if (pexpRange)
		pexpFlagsTemp = pexpRange;
	else if (pexpPriority)
		pexpFlagsTemp = pexpPriority;

	assert(pexpFlagsTemp);
	pexpFlags = pexpFlagsTemp->SimplifyAndUnscale(pcman->GlyphAttrMatrix(), -1, setpsymBogus, pfont, false, &fCanSub);
	if (pexpFlagsTemp != pexpFlags)
		delete pexpFlagsTemp;

	GdlAttrValueSpec * pavsFlagsNew = new GdlAttrValueSpec(psymCollisionFlags, psymEquals, pexpFlags);

	if (ipavsFlags >= 0)
	{
		ReplaceAttrSetting(ipavsFlags, pavsFlagsNew);
		if (ipavsRange >= 0)
			EraseAttrSetting(ipavsRange);
		if (ipavsPriority >= 0)
			EraseAttrSetting(ipavsPriority);
	}
	else if (ipavsRange >= 0)
	{
		ReplaceAttrSetting(ipavsRange, pavsFlagsNew);
		if (ipavsPriority >= 0)
			EraseAttrSetting(ipavsPriority);
	}
	else
	{
		ReplaceAttrSetting(ipavsPriority, pavsFlagsNew);
	}
}